

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

size_t exr_compress_max_buffer_size(size_t in_bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RDI;
  size_t extra;
  size_t r;
  undefined8 local_18;
  undefined8 local_8;
  
  uVar1 = libdeflate_zlib_compress_bound(0,in_RDI);
  if (uVar1 < 0xfffffffffffffff7) {
    if (in_RDI * 0x82 < in_RDI) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      uVar2 = in_RDI * 0x82 >> 7;
      if (uVar2 < 0xffffffffffffff9c) {
        local_18 = uVar1 + 9;
        if (uVar1 + 9 < uVar2) {
          local_18 = uVar2;
        }
        local_8 = local_18;
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

size_t exr_compress_max_buffer_size (size_t in_bytes)
{
    size_t r, extra;

    r = libdeflate_zlib_compress_bound (NULL, in_bytes);
    /*
     * lib deflate has a message about needing a 9 byte boundary
     * but is unclear if it actually adds that or not
     * (see the comment on libdeflate_deflate_compress)
     */
    if (r > (SIZE_MAX - 9))
        return (size_t)(SIZE_MAX);
    r += 9;

    /*
     * old library had uiAdd( uiAdd( in, ceil(in * 0.01) ), 100 )
     */
    extra = (in_bytes * (size_t)130);
    if (extra < in_bytes)
        return (size_t)(SIZE_MAX);
    extra /= (size_t)128;

    if (extra > (SIZE_MAX - 100))
        return (size_t)(SIZE_MAX);

    if (extra > r)
        r = extra;
    return r;
}